

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.hpp
# Opt level: O0

void __thiscall
cfgfile::lexical_analyzer_t<cfgfile::string_trait_t>::skip_multi_line_comment
          (lexical_analyzer_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  char_t cVar2;
  input_stream_t<cfgfile::string_trait_t> *in_RDI;
  char_t next_char;
  input_stream_t<cfgfile::string_trait_t> *in_stack_00000008;
  char_t ch;
  char local_a;
  
  bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_RDI);
  if (!bVar1) {
    cVar2 = input_stream_t<cfgfile::string_trait_t>::get(in_stack_00000008);
    bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_RDI);
    if ((!bVar1) &&
       ((local_a = input_stream_t<cfgfile::string_trait_t>::get(in_stack_00000008),
        cVar2 != const_t<cfgfile::string_trait_t>::c_sharp ||
        (local_a != const_t<cfgfile::string_trait_t>::c_vertical_bar)))) {
      do {
        bVar1 = input_stream_t<cfgfile::string_trait_t>::at_end(in_RDI);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          return;
        }
        cVar2 = input_stream_t<cfgfile::string_trait_t>::get(in_stack_00000008);
        bVar1 = local_a != const_t<cfgfile::string_trait_t>::c_sharp;
        local_a = cVar2;
      } while ((bVar1) || (cVar2 != const_t<cfgfile::string_trait_t>::c_vertical_bar));
    }
  }
  return;
}

Assistant:

void skip_multi_line_comment()
	{
		if( !m_stream.at_end() )
		{
			typename Trait::char_t ch = m_stream.get();

			if( m_stream.at_end() )
				return;

			typename Trait::char_t next_char = m_stream.get();

			if( ch == const_t< Trait >::c_sharp &&
				next_char == const_t< Trait >::c_vertical_bar )
					return;

			while( !m_stream.at_end() )
			{
				ch = next_char;

				next_char = m_stream.get();

				if( ch == const_t< Trait >::c_sharp &&
					next_char == const_t< Trait >::c_vertical_bar )
						break;
			}
		}
	}